

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbound_index.cpp
# Opt level: O3

void __thiscall duckdb::UnboundIndex::CommitDrop(UnboundIndex *this)

{
  pointer pFVar1;
  pointer pBVar2;
  int iVar3;
  undefined4 extraout_var;
  BlockPointer *block;
  pointer pBVar4;
  FixedSizeAllocatorInfo *info;
  pointer pFVar5;
  
  iVar3 = (*((this->super_Index).table_io_manager)->_vptr_TableIOManager[2])();
  pFVar1 = (this->storage_info).allocator_infos.
           super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
           .
           super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar5 = (this->storage_info).allocator_infos.
                super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                .
                super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar1; pFVar5 = pFVar5 + 1) {
    pBVar2 = (pFVar5->block_pointers).
             super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
             super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (pBVar4 = (pFVar5->block_pointers).
                  super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                  _M_impl.super__Vector_impl_data._M_start; pBVar4 != pBVar2; pBVar4 = pBVar4 + 1) {
      if (pBVar4->block_id != -1) {
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
                  ((long *)CONCAT44(extraout_var,iVar3));
      }
    }
  }
  return;
}

Assistant:

void UnboundIndex::CommitDrop() {
	auto &block_manager = table_io_manager.GetIndexBlockManager();
	for (auto &info : storage_info.allocator_infos) {
		for (auto &block : info.block_pointers) {
			if (block.IsValid()) {
				block_manager.MarkBlockAsModified(block.block_id);
			}
		}
	}
}